

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QString * simpleTypeString(Type t)

{
  uint in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView in_stack_00000000;
  int simpleType;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char (*in_stack_ffffffffffffff68) [11];
  QString *pQVar1;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QChar fillChar;
  QMessageLogger local_58;
  QChar local_32 [9];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI - 0x100 < 0x100) {
    pQVar1 = in_RDI;
    QByteArrayView::QByteArrayView<11ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    fillChar.ucs = (char16_t)((ulong)pQVar1 >> 0x30);
    pQVar1 = &local_20;
    QString::fromLatin1(in_stack_00000000);
    QChar::QChar<char16_t,_true>(local_32,L' ');
    QString::arg<int,_true>
              (pQVar1,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               fillChar);
    QString::~QString((QString *)0x489e20);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               *in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QMessageLogger::warning(&local_58,"QCborValue: found unknown type 0x%x",(ulong)in_ESI);
    QString::QString((QString *)0x489e77);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString simpleTypeString(QCborValue::Type t)
{
    int simpleType = t - QCborValue::SimpleType;
    if (unsigned(simpleType) < 0x100)
        return QString::fromLatin1("simple(%1)").arg(simpleType);

    // if we got here, we got an unknown type
    qWarning("QCborValue: found unknown type 0x%x", t);
    return QString();

}